

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void atomic2gen(lua_State *L,global_State *g)

{
  GCObject *pGVar1;
  
  g->allweak = (GCObject *)0x0;
  g->weak = (GCObject *)0x0;
  g->ephemeron = (GCObject *)0x0;
  g->gray = (GCObject *)0x0;
  g->grayagain = (GCObject *)0x0;
  g->gcstate = '\x03';
  sweep2old(L,&g->allgc);
  pGVar1 = g->allgc;
  g->survival = pGVar1;
  g->old1 = pGVar1;
  g->reallyold = pGVar1;
  g->firstold1 = (GCObject *)0x0;
  sweep2old(L,&g->finobj);
  pGVar1 = g->finobj;
  g->finobjsur = pGVar1;
  g->finobjold1 = pGVar1;
  g->finobjrold = pGVar1;
  sweep2old(L,&g->tobefnz);
  g->gckind = '\x01';
  g->lastatomic = 0;
  g->GCestimate = g->GCdebt + g->totalbytes;
  finishgencycle(L,g);
  return;
}

Assistant:

static void atomic2gen (lua_State *L, global_State *g) {
  cleargraylists(g);
  /* sweep all elements making them old */
  g->gcstate = GCSswpallgc;
  sweep2old(L, &g->allgc);
  /* everything alive now is old */
  g->reallyold = g->old1 = g->survival = g->allgc;
  g->firstold1 = NULL;  /* there are no OLD1 objects anywhere */

  /* repeat for 'finobj' lists */
  sweep2old(L, &g->finobj);
  g->finobjrold = g->finobjold1 = g->finobjsur = g->finobj;

  sweep2old(L, &g->tobefnz);

  g->gckind = KGC_GEN;
  g->lastatomic = 0;
  g->GCestimate = gettotalbytes(g);  /* base for memory control */
  finishgencycle(L, g);
}